

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_BrowseNext(UA_Server *server,UA_Session *session,UA_BrowseNextRequest *request,
                       UA_BrowseNextResponse *response)

{
  UA_StatusCode UVar1;
  UA_BrowseResult *pUVar2;
  long lVar3;
  size_t __nmemb;
  long lVar4;
  
  __nmemb = request->continuationPointsSize;
  if (__nmemb == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_BrowseResult *)calloc(__nmemb,0x28);
    response->results = pUVar2;
    if (pUVar2 != (UA_BrowseResult *)0x0) {
      response->resultsSize = __nmemb;
      lVar3 = 0;
      lVar4 = 0;
      do {
        UA_Server_browseNext_single
                  (server,session,request->releaseContinuationPoints,
                   (UA_ByteString *)((long)&request->continuationPoints->length + lVar3),
                   (UA_BrowseResult *)((long)&response->results->statusCode + lVar4));
        lVar4 = lVar4 + 0x28;
        lVar3 = lVar3 + 0x10;
        __nmemb = __nmemb - 1;
      } while (__nmemb != 0);
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_BrowseNext(UA_Server *server, UA_Session *session, const UA_BrowseNextRequest *request,
                        UA_BrowseNextResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing BrowseNextRequest");
    if(request->continuationPointsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
    size_t size = request->continuationPointsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_BROWSERESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i)
        UA_Server_browseNext_single(server, session, request->releaseContinuationPoints,
                                    &request->continuationPoints[i], &response->results[i]);
}